

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

LessEqualLayerParams * __thiscall
CoreML::Specification::LessEqualLayerParams::New(LessEqualLayerParams *this,Arena *arena)

{
  LessEqualLayerParams *this_00;
  LessEqualLayerParams *n;
  Arena *arena_local;
  LessEqualLayerParams *this_local;
  
  this_00 = (LessEqualLayerParams *)operator_new(0x18);
  LessEqualLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::LessEqualLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

LessEqualLayerParams* LessEqualLayerParams::New(::google::protobuf::Arena* arena) const {
  LessEqualLayerParams* n = new LessEqualLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}